

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O0

void telnet_ttype_is(telnet_t *telnet,char *ttype)

{
  size_t size;
  char *local_18;
  char *ttype_local;
  telnet_t *telnet_local;
  
  local_18 = ttype;
  if (ttype == (char *)0x0) {
    local_18 = "NVT";
  }
  _send(telnet,(char *)telnet_ttype_is::IS,4);
  size = strlen(local_18);
  _send(telnet,local_18,size);
  telnet_iac(telnet,0xf0);
  return;
}

Assistant:

void telnet_ttype_is(telnet_t *telnet, const char* ttype) {
	static const unsigned char IS[] = { TELNET_IAC, TELNET_SB,
			TELNET_TELOPT_TTYPE, TELNET_TTYPE_IS };
	if (!ttype) {
		ttype = "NVT";
	}
	_sendu(telnet, IS, sizeof(IS));
	_send(telnet, ttype, strlen(ttype));
	telnet_finish_sb(telnet);
}